

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

vector<AEntity_*,_std::allocator<AEntity_*>_> * __thiscall
Api::getCurrentHand(Api *this,bool verbose)

{
  int iVar1;
  Player *pPVar2;
  vector<AEntity_*,_std::allocator<AEntity_*>_> *pvVar3;
  ostream *poVar4;
  ACard *this_00;
  undefined7 in_register_00000031;
  ulong uVar5;
  string local_50;
  
  pPVar2 = GameManager::get_player(&this->_game);
  iVar1 = GameManager::get_playerTurn(&this->_game);
  pvVar3 = Player::get_hands(pPVar2 + iVar1);
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Hand current player :");
    std::endl<char,std::char_traits<char>>(poVar4);
    for (uVar5 = 0;
        uVar5 < (ulong)((long)(pvVar3->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar3->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar5);
      poVar4 = std::operator<<(poVar4,": ");
      this_00 = AEntity::get_reference
                          ((pvVar3->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar5]);
      ACard::get_name_abi_cxx11_(&local_50,this_00);
      poVar4 = std::operator<<(poVar4,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return pvVar3;
}

Assistant:

const std::vector<AEntity *> &Api::getCurrentHand(bool verbose) {
    if (verbose){
        const std::vector<AEntity *> &hand = this->_game.get_player()[this->_game.get_playerTurn()].get_hands();
        std::cout << "Hand current player :" << std::endl;
        for (int i = 0; i < hand.size(); i += 1) {
            std::cout << i << ": " << hand[i]->get_reference()->get_name() << std::endl;
        }
        return hand;
    } else {
        return this->_game.get_player()[this->_game.get_playerTurn()].get_hands();
    }
}